

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Storage * createStorage(void)

{
  bool bVar1;
  ostream *poVar2;
  Storage *in_RDI;
  int local_bc;
  undefined1 local_b8 [4];
  int i_2;
  string local_98 [39];
  undefined1 local_71;
  undefined4 local_70;
  int local_6c;
  undefined1 local_68 [4];
  int i_1;
  undefined1 local_45;
  int local_38;
  int local_34;
  int i;
  int size;
  string storageName;
  Storage *storage1;
  
  std::__cxx11::string::string((string *)&i);
  for (local_38 = 0; local_38 < 0x12; local_38 = local_38 + 1) {
    std::operator<<((ostream *)&std::cout,"====");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Storage Name(\'r\' for random name):");
  std::operator>>((istream *)&std::cin,(string *)&i);
  poVar2 = std::operator<<((ostream *)&std::cout,"How many bytes ");
  poVar2 = std::operator<<(poVar2,(string *)&i);
  std::operator<<(poVar2," have?");
  std::istream::operator>>((istream *)&std::cin,&local_34);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                          "r");
  if (bVar1) {
    local_45 = 0;
    Storage::Storage(in_RDI,local_34);
    Storage::print(in_RDI);
    Storage::name_abi_cxx11_((Storage *)local_68);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_68);
    poVar2 = std::operator<<(poVar2," created successfully.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_68);
    for (local_6c = 0; local_6c < 0x12; local_6c = local_6c + 1) {
      std::operator<<((ostream *)&std::cout,"====");
    }
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_45 = 1;
  }
  else {
    local_71 = 0;
    std::__cxx11::string::string(local_98,(string *)&i);
    Storage::Storage(in_RDI,(string *)local_98,local_34);
    std::__cxx11::string::~string(local_98);
    Storage::print(in_RDI);
    Storage::name_abi_cxx11_((Storage *)local_b8);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_b8);
    poVar2 = std::operator<<(poVar2," created successfully.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_b8);
    for (local_bc = 0; local_bc < 0x12; local_bc = local_bc + 1) {
      std::operator<<((ostream *)&std::cout,"====");
    }
    poVar2 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_71 = 1;
  }
  local_70 = 1;
  std::__cxx11::string::~string((string *)&i);
  return in_RDI;
}

Assistant:

Storage createStorage() {
    string storageName;
    int size;

    for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
        cout<<"====";
    }
    cout<<endl;

    cout<<"Storage Name('r' for random name):";
    cin>>storageName;
    cout<<"How many bytes "<<storageName<<" have?";
    cin>>size;

    if (storageName=="r") {
        Storage storage1(size);
        storage1.print();
        cout << storage1.name() << " created successfully." << endl;
        for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
            cout<<"====";
        }
        cout<<endl<<endl;

        return storage1;
    } else {
        Storage storage1(storageName, size);
        storage1.print();
        cout << storage1.name() << " created successfully." << endl;
        for (int i = 0; i < (BITCOUNT + 1) * 2; ++i) {
            cout << "====";
        }
        cout << endl<<endl;

        return storage1;
    }
}